

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::simplifyRoundingsAndConversions(OptimizeInstructions *this,Unary *curr)

{
  bool bVar1;
  ulong uVar2;
  Expression *candidate;
  Matcher<wasm::Unary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::UnaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_50;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_20;
  matched_t<wasm::Unary_*> local_10;
  Unary *inner;
  
  uVar2 = (ulong)curr->op;
  if (uVar2 < 0x38) {
    if ((0x3fc00UL >> (uVar2 & 0x3f) & 1) == 0) {
      if ((0x40000020000000U >> (uVar2 & 0x3f) & 1) == 0) {
        if ((0x80000080000000U >> (uVar2 & 0x3f) & 1) == 0) {
          return (Expression *)0x0;
        }
        candidate = curr->value;
        local_50._8_4_ = 0x26;
      }
      else {
        candidate = curr->value;
        local_50._8_4_ = 0x24;
      }
      local_20.binder = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_10;
      local_50.binder = (matched_t<wasm::Unary_*> *)0x0;
      local_50.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::AnyKind<wasm::UnaryOp>_> *)&local_20;
      bVar1 = Match::Internal::
              Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
              ::matches((Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                         *)&local_50,candidate);
      if (bVar1) {
        return (Expression *)local_10;
      }
    }
    else {
      local_50.submatchers.next.curr = &local_20;
      local_20.binder = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0;
      local_50.binder = &local_10;
      local_50.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::AnyKind<wasm::UnaryOp>_> *)0x0;
      bVar1 = Match::Internal::
              Matcher<wasm::Unary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::UnaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
              ::matches(&local_50,curr->value);
      if ((bVar1) && (0xfffffff7 < local_10->op - PromoteFloat32)) {
        return (Expression *)local_10;
      }
    }
  }
  return (Expression *)0x0;
}

Assistant:

Expression* simplifyRoundingsAndConversions(Unary* curr) {
    using namespace Abstract;
    using namespace Match;

    switch (curr->op) {
      case TruncSFloat64ToInt32:
      case TruncSatSFloat64ToInt32: {
        // i32 -> f64 -> i32 rountripping optimization:
        //   i32.trunc(_sat)_f64_s(f64.convert_i32_s(x))  ==>  x
        Expression* x;
        if (matches(curr->value, unary(ConvertSInt32ToFloat64, any(&x)))) {
          return x;
        }
        break;
      }
      case TruncUFloat64ToInt32:
      case TruncSatUFloat64ToInt32: {
        // u32 -> f64 -> u32 rountripping optimization:
        //   i32.trunc(_sat)_f64_u(f64.convert_i32_u(x))  ==>  x
        Expression* x;
        if (matches(curr->value, unary(ConvertUInt32ToFloat64, any(&x)))) {
          return x;
        }
        break;
      }
      case CeilFloat32:
      case CeilFloat64:
      case FloorFloat32:
      case FloorFloat64:
      case TruncFloat32:
      case TruncFloat64:
      case NearestFloat32:
      case NearestFloat64: {
        // Rounding after integer to float conversion may be skipped
        //   ceil(float(int(x)))     ==>  float(int(x))
        //   floor(float(int(x)))    ==>  float(int(x))
        //   trunc(float(int(x)))    ==>  float(int(x))
        //   nearest(float(int(x)))  ==>  float(int(x))
        Unary* inner;
        if (matches(curr->value, unary(&inner, any()))) {
          switch (inner->op) {
            case ConvertSInt32ToFloat32:
            case ConvertSInt32ToFloat64:
            case ConvertUInt32ToFloat32:
            case ConvertUInt32ToFloat64:
            case ConvertSInt64ToFloat32:
            case ConvertSInt64ToFloat64:
            case ConvertUInt64ToFloat32:
            case ConvertUInt64ToFloat64: {
              return inner;
            }
            default: {
            }
          }
        }
        break;
      }
      default: {
      }
    }
    return nullptr;
  }